

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<int_const&>::operator==(expression_lhs<const_int_&> *this,int *rhs)

{
  int *in_RDX;
  undefined8 *in_RSI;
  result *in_RDI;
  int *in_stack_00000118;
  string *in_stack_00000120;
  int *in_stack_00000128;
  result *in_stack_fffffffffffffef8;
  result *passed_;
  result *this_00;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [39];
  undefined1 local_41;
  
  local_41 = *(int *)*in_RSI == *in_RDX;
  this_00 = (result *)*in_RSI;
  passed_ = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"==",&local_c9);
  std::__cxx11::string::string(local_a8,local_c8);
  to_string<int,int>(in_stack_00000128,in_stack_00000120,in_stack_00000118);
  std::__cxx11::string::string(local_68,local_88);
  result::result<bool>(this_00,&passed_->passed,(text *)in_RDI);
  result::result(in_RDI,in_stack_fffffffffffffef8);
  result::~result((result *)0x1331f5);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return passed_;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }